

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtoolbar.cpp
# Opt level: O0

void __thiscall QToolBar::setOrientation(QToolBar *this,Orientation orientation)

{
  long lVar1;
  QToolBarPrivate *pQVar2;
  Orientation in_ESI;
  undefined8 in_RDI;
  long in_FS_OFFSET;
  QToolBarPrivate *d;
  QLayout *in_stack_00000040;
  Orientation in_stack_ffffffffffffffcc;
  anon_union_4_2_313b0b05_for_QSizePolicy_1 type;
  Policy horizontal;
  undefined4 in_stack_ffffffffffffffe0;
  anon_union_4_2_313b0b05_for_QSizePolicy_1 policy;
  
  type.data = (quint32)((ulong)in_RDI >> 0x20);
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  policy.data = type.data;
  pQVar2 = d_func((QToolBar *)0x6ec7be);
  if (in_ESI != pQVar2->orientation) {
    pQVar2->orientation = in_ESI;
    horizontal = (Policy)((ulong)pQVar2 >> 0x20);
    if (in_ESI == Vertical) {
      QSizePolicy::QSizePolicy
                ((QSizePolicy *)CONCAT44(2,in_stack_ffffffffffffffe0),horizontal,(Policy)pQVar2,
                 type.data);
      QWidget::setSizePolicy
                ((QWidget *)CONCAT44(in_ESI,in_stack_ffffffffffffffe0),(QSizePolicy)policy);
    }
    else {
      QSizePolicy::QSizePolicy
                ((QSizePolicy *)CONCAT44(in_ESI,in_stack_ffffffffffffffe0),horizontal,(Policy)pQVar2
                 ,type.data);
      QWidget::setSizePolicy
                ((QWidget *)CONCAT44(in_ESI,in_stack_ffffffffffffffe0),(QSizePolicy)policy.bits);
    }
    (**(code **)(*(long *)&pQVar2->layout->super_QLayout + 0x70))();
    QLayout::activate(in_stack_00000040);
    orientationChanged((QToolBar *)0x6ec871,in_stack_ffffffffffffffcc);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QToolBar::setOrientation(Qt::Orientation orientation)
{
    Q_D(QToolBar);
    if (orientation == d->orientation)
        return;

    d->orientation = orientation;

    if (orientation == Qt::Vertical)
        setSizePolicy(QSizePolicy(QSizePolicy::Fixed, QSizePolicy::Preferred));
    else
        setSizePolicy(QSizePolicy(QSizePolicy::Preferred, QSizePolicy::Fixed));

    d->layout->invalidate();
    d->layout->activate();

    emit orientationChanged(d->orientation);
}